

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSharedData::SetCircleSegmentMaxError(ImDrawListSharedData *this,float max_error)

{
  int iVar1;
  float fVar2;
  int segment_count;
  float radius;
  int i;
  float max_error_local;
  ImDrawListSharedData *this_local;
  
  if ((this->CircleSegmentMaxError != max_error) ||
     (NAN(this->CircleSegmentMaxError) || NAN(max_error))) {
    this->CircleSegmentMaxError = max_error;
    for (segment_count = 0; segment_count < 0x40; segment_count = segment_count + 1) {
      fVar2 = acosf((((float)segment_count + 1.0) - this->CircleSegmentMaxError) /
                    ((float)segment_count + 1.0));
      iVar1 = ImClamp<int>((int)(6.2831855 / fVar2),0xc,0x200);
      iVar1 = ImMin<int>(iVar1,0xff);
      this->CircleSegmentCounts[segment_count] = (ImU8)iVar1;
    }
  }
  return;
}

Assistant:

void ImDrawListSharedData::SetCircleSegmentMaxError(float max_error)
{
    if (CircleSegmentMaxError == max_error)
        return;
    CircleSegmentMaxError = max_error;
    for (int i = 0; i < IM_ARRAYSIZE(CircleSegmentCounts); i++)
    {
        const float radius = i + 1.0f;
        const int segment_count = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, CircleSegmentMaxError);
        CircleSegmentCounts[i] = (ImU8)ImMin(segment_count, 255);
    }
}